

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtConvexTriangleCallback::setTimeStepAndCounters
          (cbtConvexTriangleCallback *this,cbtScalar collisionMarginTriangle,
          cbtDispatcherInfo *dispatchInfo,cbtCollisionObjectWrapper *convexBodyWrap,
          cbtCollisionObjectWrapper *triBodyWrap,cbtManifoldResult *resultOut)

{
  cbtCollisionShape *pcVar1;
  cbtTransform convexInTriangleSpace;
  cbtTransform local_e8;
  cbtScalar local_a8 [2];
  cbtScalar acStack_a0 [2];
  cbtScalar acStack_98 [2];
  cbtScalar acStack_90 [2];
  cbtScalar acStack_88 [2];
  cbtScalar acStack_80 [2];
  cbtScalar acStack_78 [2];
  cbtScalar acStack_70 [4];
  cbtTransform local_60;
  
  this->m_convexBodyWrap = convexBodyWrap;
  this->m_triBodyWrap = triBodyWrap;
  this->m_dispatchInfoPtr = dispatchInfo;
  this->m_collisionMarginTriangle = collisionMarginTriangle;
  this->m_resultOut = resultOut;
  cbtTransform::inverse(&local_60,triBodyWrap->m_worldTransform);
  cbtTransform::operator*(&local_e8,&local_60,this->m_convexBodyWrap->m_worldTransform);
  local_a8[0] = local_e8.m_basis.m_el[0].m_floats[0];
  local_a8[1] = local_e8.m_basis.m_el[0].m_floats[1];
  acStack_a0[0] = local_e8.m_basis.m_el[0].m_floats[2];
  acStack_a0[1] = local_e8.m_basis.m_el[0].m_floats[3];
  acStack_98[0] = local_e8.m_basis.m_el[1].m_floats[0];
  acStack_98[1] = local_e8.m_basis.m_el[1].m_floats[1];
  acStack_90[0] = local_e8.m_basis.m_el[1].m_floats[2];
  acStack_90[1] = local_e8.m_basis.m_el[1].m_floats[3];
  acStack_88[0] = local_e8.m_basis.m_el[2].m_floats[0];
  acStack_88[1] = local_e8.m_basis.m_el[2].m_floats[1];
  acStack_80[0] = local_e8.m_basis.m_el[2].m_floats[2];
  acStack_80[1] = local_e8.m_basis.m_el[2].m_floats[3];
  acStack_78[0] = local_e8.m_origin.m_floats[0];
  acStack_78[1] = local_e8.m_origin.m_floats[1];
  acStack_70[0] = local_e8.m_origin.m_floats[2];
  acStack_70[1] = local_e8.m_origin.m_floats[3];
  pcVar1 = this->m_convexBodyWrap->m_shape;
  (*pcVar1->_vptr_cbtCollisionShape[2])(pcVar1,local_a8,&this->m_aabbMin,&this->m_aabbMax);
  local_e8.m_basis.m_el[0].m_floats =
       (cbtScalar  [4])
       vpshufb_avx(ZEXT416((uint)(collisionMarginTriangle +
                                 resultOut->m_closestPointDistanceThreshold)),_DAT_00f5c6f0);
  cbtVector3::operator+=(&this->m_aabbMax,(cbtVector3 *)&local_e8);
  cbtVector3::operator-=(&this->m_aabbMin,(cbtVector3 *)&local_e8);
  return;
}

Assistant:

void cbtConvexTriangleCallback::setTimeStepAndCounters(cbtScalar collisionMarginTriangle, const cbtDispatcherInfo& dispatchInfo, const cbtCollisionObjectWrapper* convexBodyWrap, const cbtCollisionObjectWrapper* triBodyWrap, cbtManifoldResult* resultOut)
{
	m_convexBodyWrap = convexBodyWrap;
	m_triBodyWrap = triBodyWrap;

	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle;
	m_resultOut = resultOut;

	//recalc aabbs
	cbtTransform convexInTriangleSpace;
	convexInTriangleSpace = m_triBodyWrap->getWorldTransform().inverse() * m_convexBodyWrap->getWorldTransform();
	const cbtCollisionShape* convexShape = static_cast<const cbtCollisionShape*>(m_convexBodyWrap->getCollisionShape());
	//CollisionShape* triangleShape = static_cast<cbtCollisionShape*>(triBody->m_collisionShape);
	convexShape->getAabb(convexInTriangleSpace, m_aabbMin, m_aabbMax);
	cbtScalar extraMargin = collisionMarginTriangle + resultOut->m_closestPointDistanceThreshold;

	cbtVector3 extra(extraMargin, extraMargin, extraMargin);

	m_aabbMax += extra;
	m_aabbMin -= extra;
}